

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_lbd_create_cumulative_image.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  int M;
  int iVar2;
  ostream *poVar3;
  LBDOperator *this;
  _InputArray *p_Var4;
  char *pcVar5;
  int local_2e8;
  allocator local_2e1;
  int local_2e0;
  int optionIndex;
  undefined4 local_2d8 [2];
  Mat *local_2d0;
  undefined8 local_2c8;
  _Vector_base<int,_std::allocator<int>_> local_2b8;
  int local_298;
  int local_294;
  Mat res8;
  _InputArray local_230;
  Mat result;
  stringstream windowNameStr;
  
  if (argc < 2) {
    print_usage(_stdout,argv);
  }
  else {
    M = 0x200;
    iVar2 = 0x20;
    local_2e8 = 0;
    local_2e0 = 0;
    pcVar5 = "i:m:n:p:";
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                iVar1 = getopt_long(argc,argv,pcVar5,main::long_options,&optionIndex);
                __s1 = _optarg;
                if (iVar1 != 0) break;
                pcVar5 = "m:n:p:";
                if (optionIndex == 0) {
                  iVar1 = strncmp(_optarg,"freak",5);
                  pcVar5 = "m:n:p:";
                  local_2e8 = 0;
                  if (iVar1 != 0) {
                    iVar1 = strncmp(__s1,"brief",5);
                    pcVar5 = "m:n:p:";
                    local_2e8 = 2;
                    if (iVar1 != 0) {
                      iVar1 = strncmp(__s1,"exfreak",7);
                      local_2e8 = (uint)(iVar1 == 0) * 2 + 1;
                      pcVar5 = "m:n:p:";
                    }
                  }
                }
              }
              if (iVar1 != 0x3f) break;
              poVar3 = std::operator<<((ostream *)&std::cerr,"Unknown option: -");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3f);
              std::operator<<(poVar3," (ignored)\n");
              pcVar5 = "m:n:p:";
            }
            if (iVar1 != 0x6d) break;
            M = atoi(_optarg);
            if (M < 2) {
              M = 1;
            }
            pcVar5 = "m:n:p:";
          }
          if (iVar1 != 0x6e) break;
          local_2e0 = atoi(_optarg);
          pcVar5 = "m:n:p:";
        }
        if (iVar1 != 0x70) break;
        iVar2 = atoi(_optarg);
        iVar2 = iVar2 % 2 + iVar2;
        pcVar5 = "m:n:p:";
      }
      pcVar5 = "m:n:p:";
    } while (iVar1 != -1);
    this = lts2::CreateLbdOperator(local_2e8,M);
    local_298 = iVar2;
    local_294 = iVar2;
    (*(this->super_LinearOperator)._vptr_LinearOperator[5])(this);
    cv::Mat::Mat(&result);
    lts2::LBDOperator::drawSelfInImage(this,&result,local_2e0);
    _windowNameStr = 0x1010000;
    _res8 = 0x3010000;
    p_Var4 = (_InputArray *)cv::noArray();
    cv::normalize((_InputArray *)&windowNameStr,(_InputOutputArray *)&res8,0.0,1.0,0x20,-1,p_Var4);
    std::__cxx11::stringstream::stringstream((stringstream *)&windowNameStr);
    cv::Mat::Mat(&res8);
    local_2c8 = 0;
    local_2d8[0] = 0x2010000;
    local_2d0 = &res8;
    cv::Mat::convertTo((_OutputArray *)&result,(int)local_2d8,255.0,0.0);
    std::__cxx11::string::string((string *)local_2d8,argv[(ulong)(uint)argc - 1],&local_2e1);
    local_230.sz.width = 0;
    local_230.sz.height = 0;
    local_230.flags = 0x1010000;
    local_2b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_230.obj = &res8;
    cv::imwrite((string *)local_2d8,&local_230,(vector *)&local_2b8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2b8);
    std::__cxx11::string::~string((string *)local_2d8);
    cv::Mat::~Mat(&res8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&windowNameStr);
    cv::Mat::~Mat(&result);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  if (argc < 2)
  {
    print_usage(stdout, argv);
    return 0;
  }

  int lbdType = 0;
  int pside = 32;
  int M = 512;
  int normalize = 0;

  static struct option long_options[] = {
    {"lbd", required_argument, 0, 0},
    {0, 0, 0, 0}
  };

  int optionIndex;
  int c = getopt_long(argc, argv, "i:m:n:p:", long_options, &optionIndex);
  
  while (c != -1)
  {
    switch (c)
    {
    case 0:
      if (optionIndex == 0)
      {
        if (strncmp(optarg, "freak", 5) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeFreak;
        else if (strncmp(optarg, "brief", 5) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeBrief;
        else if (strncmp(optarg, "exfreak", 7) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeExFreak;
        else lbdType = (int)lbd::LBD_TYPE::eTypeRandomFreak;
      }
      break;
      
    case 'm':
      M = MAX(1, atoi(optarg));
      break;

    case 'n':
      normalize = atoi(optarg);
      break;

    case 'p':
      pside = atoi(optarg);
      pside += (pside % 2);   // Enforce even size
      break;

    case '?':
      std::cerr << "Unknown option: -" << c << " (ignored)\n";
      break;

    default:
      break;
    }

    c = getopt_long(argc, argv, "m:n:p:", long_options, &optionIndex);
  }

  cv::Size patchSize(pside,pside);
  lts2::LBDOperator *LBD = lts2::CreateLbdOperator(lbdType, M);
  LBD->initWithPatchSize(patchSize);

  cv::Mat result;
  LBD->drawSelfInImage(result, normalize);
  cv::normalize(result, result, 0.0, 1.0, cv::NORM_MINMAX);

  std::stringstream windowNameStr;

  cv::Mat res8;
  result.convertTo(res8, CV_8U, 255.0);

  cv::imwrite(argv[argc-1], res8);

  return EXIT_SUCCESS;
}